

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O2

bool __thiscall spirv_cross::SPIRConstant::constant_is_null(SPIRConstant *this)

{
  Constant *pCVar1;
  uint32_t col;
  ulong uVar2;
  uint32_t row;
  ulong uVar3;
  ConstantMatrix *pCVar4;
  
  if ((this->specialization == false) &&
     ((this->subconstants).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.
      buffer_size == 0)) {
    pCVar4 = &this->m;
    uVar2 = 0;
    do {
      if (uVar2 == (this->m).columns) {
        return true;
      }
      uVar3 = 0;
      while ((this->m).c[0].vecsize != uVar3) {
        pCVar1 = pCVar4->c[0].r + uVar3;
        uVar3 = uVar3 + 1;
        if (pCVar1->u64 != 0) {
          return false;
        }
      }
      uVar2 = uVar2 + 1;
      pCVar4 = (ConstantMatrix *)(pCVar4->c + 1);
    } while( true );
  }
  return false;
}

Assistant:

inline bool constant_is_null() const
	{
		if (specialization)
			return false;
		if (!subconstants.empty())
			return false;

		for (uint32_t col = 0; col < columns(); col++)
			for (uint32_t row = 0; row < vector_size(); row++)
				if (scalar_u64(col, row) != 0)
					return false;

		return true;
	}